

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O2

EStatusCode __thiscall CFFFileInput::ReadTopDictIndex(CFFFileInput *this,unsigned_short inFontIndex)

{
  CFFPrimitiveReader *this_00;
  unsigned_long *puVar1;
  EStatusCode EVar2;
  LongFilePositionType LVar3;
  ulong *puVar4;
  unsigned_long uVar5;
  TopDictInfo *pTVar6;
  ulong uVar7;
  long lVar8;
  unsigned_short dictionariesCount;
  unsigned_long *offsets;
  
  this_00 = &this->mPrimitivesReader;
  LVar3 = CFFPrimitiveReader::GetCurrentPosition(this_00);
  this->mTopDictIndexPosition = LVar3;
  EVar2 = ReadIndexHeader(this,&offsets,&dictionariesCount);
  if (EVar2 == eSuccess) {
    uVar7 = (ulong)dictionariesCount;
    lVar8 = uVar7 * 0x50;
    puVar4 = (ulong *)operator_new__(lVar8 + 8);
    puVar1 = offsets;
    pTVar6 = (TopDictInfo *)(puVar4 + 1);
    *puVar4 = uVar7;
    if (uVar7 != 0) {
      puVar4 = puVar4 + 2;
      do {
        *(undefined4 *)puVar4 = 0;
        puVar4[1] = 0;
        puVar4[2] = (ulong)puVar4;
        puVar4[3] = (ulong)puVar4;
        puVar4[8] = 0;
        puVar4[4] = 0;
        puVar4[5] = 0;
        puVar4[6] = 0;
        puVar4[7] = 0;
        puVar4 = puVar4 + 10;
        lVar8 = lVar8 + -0x50;
      } while (lVar8 != 0);
    }
    this->mTopDictIndex = pTVar6;
    uVar7 = (ulong)inFontIndex;
    if (offsets[uVar7] == 1) {
      uVar5 = 1;
    }
    else {
      CFFPrimitiveReader::Skip(this_00,offsets[uVar7] - 1);
      uVar5 = puVar1[uVar7];
      pTVar6 = this->mTopDictIndex;
    }
    EVar2 = ReadDict(this,puVar1[uVar7 + 1] - uVar5,&pTVar6[uVar7].mTopDict);
  }
  if (offsets != (unsigned_long *)0x0) {
    operator_delete__(offsets);
  }
  if (EVar2 == eSuccess) {
    EVar2 = CFFPrimitiveReader::GetInternalState(this_00);
  }
  return EVar2;
}

Assistant:

EStatusCode CFFFileInput::ReadTopDictIndex(unsigned short inFontIndex)
{
	mTopDictIndexPosition = mPrimitivesReader.GetCurrentPosition();

	// will read only what's necessary for the font index, nulling items in the path
	
	unsigned long* offsets;
	unsigned short dictionariesCount;
	EStatusCode status = ReadIndexHeader(&offsets,dictionariesCount);
	
	do
	{
		if(status != PDFHummus::eSuccess)
			break;

		// allocate all, but read just the required font
		mTopDictIndex = new TopDictInfo[dictionariesCount];

		if(offsets[inFontIndex] != 1)
			mPrimitivesReader.Skip(offsets[inFontIndex] - 1);
		status = ReadDict(offsets[inFontIndex+1] - offsets[inFontIndex],mTopDictIndex[inFontIndex].mTopDict);
	}while(false);

	delete[] offsets;
	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();
}